

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cymric.cpp
# Opt level: O3

int read_file(char *path,uint8_t *buffer,int bytes)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  iVar4 = 0;
  iVar6 = 100;
  do {
    uVar5 = bytes - iVar4;
    iVar1 = open(path,0);
    if (-1 < iVar1) {
      uVar2 = fcntl(iVar1,3,0);
      fcntl(iVar1,4,(ulong)(uVar2 | 0x800));
      sVar3 = read(iVar1,buffer,(long)(int)uVar5);
      uVar5 = (uint)sVar3;
      close(iVar1);
    }
    if ((int)uVar5 < 1) {
      iVar1 = iVar6 + -1;
    }
    else {
      buffer = buffer + uVar5;
      iVar4 = iVar4 + uVar5;
      iVar1 = iVar6;
    }
  } while (((int)uVar5 >= 1 || 0 < iVar6) && (iVar6 = iVar1, iVar4 < bytes));
  return iVar4;
}

Assistant:

static int read_file(const char *path, uint8_t *buffer, int bytes) {
    int completed = 0, retries = 100;

    do {
        int len = bytes - completed;

        // Attempt to open the file
        int fd = open(path, O_RDONLY);
        if (fd >= 0) {
            // Set non-blocking mode
            int flags = fcntl(fd, F_GETFL, 0);
            fcntl(fd, F_SETFL, flags | O_NONBLOCK);

            // Launch read request and close file
            len = read(fd, buffer, len);
            close(fd);
        }

        // If read request failed (ie. blocking):
        if (len <= 0) {
            if (--retries >= 0) {
                continue;
            } else {
                // Give up
                break;
            }
        }

        // Subtract off the read byte count from request size
        completed += len;
        buffer += len;
    } while (completed < bytes);

    // Return number of bytes completed
    return completed;
}